

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O1

void __thiscall
BamTools::Internal::BamStandardIndex::CalculateCandidateOffsets
          (BamStandardIndex *this,BaiReferenceSummary *refSummary,uint64_t *minOffset,
          set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_>
          *candidateBins,vector<long,_std::allocator<long>_> *offsets)

{
  char *pcVar1;
  ulong uVar2;
  ulong uVar3;
  iterator __position;
  ulong uVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  _Base_ptr p_Var10;
  int iVar11;
  bool bVar12;
  int32_t numAlignmentChunks;
  uint32_t binId;
  int local_60;
  undefined2 local_5c [2];
  ulong local_58;
  _Base_ptr local_50;
  _Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
  *local_48;
  BaiReferenceSummary *local_40;
  const_iterator local_38;
  
  local_58 = refSummary->FirstBinFilePosition;
  iVar7 = 0;
  Seek(this,(int64_t *)&local_58,0);
  if (0 < refSummary->NumBins) {
    p_Var10 = &(candidateBins->_M_t)._M_impl.super__Rb_tree_header._M_header;
    local_50 = p_Var10;
    local_48 = (_Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
                *)candidateBins;
    local_40 = refSummary;
    do {
      ReadBinIntoBuffer(this,(uint32_t *)local_5c,&local_60);
      p_Var5 = p_Var10;
      for (p_Var6 = *(_Base_ptr *)((long)candidateBins + 0x10); p_Var6 != (_Base_ptr)0x0;
          p_Var6 = (&p_Var6->_M_left)[bVar12]) {
        bVar12 = (ushort)(short)p_Var6[1]._M_color < (ushort)local_5c[0];
        if (!bVar12) {
          p_Var5 = p_Var6;
        }
      }
      p_Var6 = p_Var10;
      if ((p_Var5 != p_Var10) &&
         (p_Var6 = p_Var5, (ushort)local_5c[0] < (ushort)(short)p_Var5[1]._M_color)) {
        p_Var6 = p_Var10;
      }
      if (p_Var6 != p_Var10) {
        local_38._M_node = p_Var6;
        if (0 < local_60) {
          iVar11 = 0;
          lVar9 = 8;
          do {
            pcVar1 = (this->m_resources).Buffer;
            uVar2 = *(ulong *)(pcVar1 + lVar9 + -8);
            uVar3 = *(ulong *)(pcVar1 + lVar9);
            uVar8 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                    (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                    (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 |
                    (uVar3 & 0xff00) << 0x28 | uVar3 << 0x38;
            uVar4 = uVar2 >> 0x38 | (uVar2 & 0xff000000000000) >> 0x28 |
                    (uVar2 & 0xff0000000000) >> 0x18 | (uVar2 & 0xff00000000) >> 8 |
                    (uVar2 & 0xff000000) << 8 | (uVar2 & 0xff0000) << 0x18 |
                    (uVar2 & 0xff00) << 0x28 | uVar2 << 0x38;
            if (this->m_isBigEndian == false) {
              uVar8 = uVar3;
              uVar4 = uVar2;
            }
            if (*minOffset <= uVar8) {
              __position._M_current =
                   (offsets->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              local_58 = uVar4;
              if (__position._M_current ==
                  (offsets->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<long,_std::allocator<long>_>::_M_realloc_insert<long>
                          (offsets,__position,(long *)&local_58);
              }
              else {
                *__position._M_current = uVar4;
                (offsets->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                super__Vector_impl_data._M_finish = __position._M_current + 1;
              }
            }
            iVar11 = iVar11 + 1;
            lVar9 = lVar9 + 0x10;
          } while (iVar11 < local_60);
        }
        candidateBins =
             (set<unsigned_short,_std::less<unsigned_short>,_std::allocator<unsigned_short>_> *)
             local_48;
        std::
        _Rb_tree<unsigned_short,unsigned_short,std::_Identity<unsigned_short>,std::less<unsigned_short>,std::allocator<unsigned_short>>
        ::erase_abi_cxx11_(local_48,local_38);
        p_Var10 = local_50;
        if (*(long *)((long)candidateBins + 0x28) == 0) {
          return;
        }
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 < local_40->NumBins);
  }
  return;
}

Assistant:

void BamStandardIndex::CalculateCandidateOffsets(const BaiReferenceSummary& refSummary,
                                                 const uint64_t& minOffset,
                                                 std::set<uint16_t>& candidateBins,
                                                 std::vector<int64_t>& offsets)
{
    // seek to first bin
    Seek(refSummary.FirstBinFilePosition, SEEK_SET);

    // iterate over reference bins
    uint32_t binId;
    int32_t numAlignmentChunks;
    std::set<uint16_t>::iterator candidateBinIter;
    for (int i = 0; i < refSummary.NumBins; ++i) {

        // read bin contents (if successful, alignment chunks are now in m_buffer)
        ReadBinIntoBuffer(binId, numAlignmentChunks);

        // see if bin is a 'candidate bin'
        candidateBinIter = candidateBins.find(binId);

        // if not, move on to next bin
        if (candidateBinIter == candidateBins.end()) continue;

        // otherwise, check bin's contents against for overlap
        else {

            std::size_t offset = 0;
            uint64_t chunkStart;
            uint64_t chunkStop;

            // iterate over alignment chunks
            for (int j = 0; j < numAlignmentChunks; ++j) {

                // read chunk start & stop from buffer
                memcpy((char*)&chunkStart, m_resources.Buffer + offset, sizeof(uint64_t));
                offset += sizeof(uint64_t);
                memcpy((char*)&chunkStop, m_resources.Buffer + offset, sizeof(uint64_t));
                offset += sizeof(uint64_t);

                // swap endian-ness if necessary
                if (m_isBigEndian) {
                    SwapEndian_64(chunkStart);
                    SwapEndian_64(chunkStop);
                }

                // store alignment chunk's start offset
                // if its stop offset is larger than our 'minOffset'
                if (chunkStop >= minOffset) offsets.push_back(chunkStart);
            }

            // 'pop' bin ID from candidate bins set
            candidateBins.erase(candidateBinIter);

            // quit if no more candidates
            if (candidateBins.empty()) break;
        }
    }
}